

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_resampler_internal.h
# Opt level: O0

cubeb_resampler_stats * __thiscall
cubeb_resampler_speex<float,_cubeb_resampler_speex_one_way<float>,_cubeb_resampler_speex_one_way<float>_>
::stats(cubeb_resampler_speex<float,_cubeb_resampler_speex_one_way<float>,_cubeb_resampler_speex_one_way<float>_>
        *this)

{
  bool bVar1;
  size_t sVar2;
  cubeb_resampler_stats *in_RDI;
  
  memset(in_RDI,0,0x20);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
                      *)0x12706a);
  if (bVar1) {
    std::
    unique_ptr<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
    ::operator->((unique_ptr<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
                  *)0x12707e);
    sVar2 = cubeb_resampler_speex_one_way<float>::input_buffer_size
                      ((cubeb_resampler_speex_one_way<float> *)0x127086);
    in_RDI->input_input_buffer_size = sVar2;
    std::
    unique_ptr<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
    ::operator->((unique_ptr<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
                  *)0x12709f);
    sVar2 = cubeb_resampler_speex_one_way<float>::output_buffer_size
                      ((cubeb_resampler_speex_one_way<float> *)0x1270a7);
    in_RDI->input_output_buffer_size = sVar2;
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
                      *)0x1270c1);
  if (bVar1) {
    std::
    unique_ptr<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
    ::operator->((unique_ptr<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
                  *)0x1270d5);
    sVar2 = cubeb_resampler_speex_one_way<float>::input_buffer_size
                      ((cubeb_resampler_speex_one_way<float> *)0x1270dd);
    in_RDI->output_input_buffer_size = sVar2;
    std::
    unique_ptr<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
    ::operator->((unique_ptr<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
                  *)0x1270f7);
    sVar2 = cubeb_resampler_speex_one_way<float>::output_buffer_size
                      ((cubeb_resampler_speex_one_way<float> *)0x1270ff);
    in_RDI->output_output_buffer_size = sVar2;
  }
  return in_RDI;
}

Assistant:

virtual cubeb_resampler_stats stats()
  {
    cubeb_resampler_stats stats = {};
    if (input_processor) {
      stats.input_input_buffer_size = input_processor->input_buffer_size();
      stats.input_output_buffer_size = input_processor->output_buffer_size();
    }
    if (output_processor) {
      stats.output_input_buffer_size = output_processor->input_buffer_size();
      stats.output_output_buffer_size = output_processor->output_buffer_size();
    }
    return stats;
  }